

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.hxx
# Opt level: O0

size_t __thiscall
andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
          (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t number)

{
  size_type a;
  size_type in_RSI;
  Vertex *in_RDI;
  size_t position;
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  *in_stack_ffffffffffffff58;
  value_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  Vertex *in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  
  a = std::
      vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ::size((vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
              *)in_RDI);
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::end(in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>::Vertex_const*,std::vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>::Vertex,std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>::Vertex>>>
  ::
  __normal_iterator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>::Vertex*>
            ((__normal_iterator<const_andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex_*,_std::vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>_>
              *)in_RDI,
             (__normal_iterator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex_*,_std::vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>_>
              *)in_stack_ffffffffffffff58);
  Vertex::Vertex(in_stack_ffffffffffffff90);
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::insert((vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
            *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88,
           in_stack_ffffffffffffff80);
  Vertex::~Vertex(in_RDI);
  IdleGraphVisitor<unsigned_long>::insertVertices
            ((IdleGraphVisitor<unsigned_long> *)
             ((long)&(in_RDI->to_).vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),a,in_RSI);
  return a;
}

Assistant:

inline std::size_t
Digraph<VISITOR>::insertVertices(
    const std::size_t number
) {
    std::size_t position = vertices_.size();
    vertices_.insert(vertices_.end(), number, Vertex());
    visitor_.insertVertices(position, number);
    return position;
}